

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

Segment * reflection(Segment *__return_storage_ptr__,Segment *segment,Triangle *triangle)

{
  Vector *pVVar1;
  float fVar2;
  Point PVar3;
  Point PVar4;
  undefined8 local_d8;
  float local_d0;
  Point local_a8 [4];
  Point local_78;
  undefined1 local_68 [8];
  Vector N;
  float fStack_54;
  float local_50;
  undefined1 local_28 [8];
  Vector ri;
  Triangle *triangle_local;
  Segment *segment_local;
  
  unique0x10000215 = triangle;
  PVar3 = operator-(segment->b,&segment->a);
  local_50 = PVar3.z;
  ri.x = local_50;
  stack0xffffffffffffffa8 = PVar3._0_8_;
  local_28._0_4_ = N.z;
  local_28._4_4_ = fStack_54;
  N.x = (stack0xffffffffffffffe8->normal).z;
  pVVar1 = &stack0xffffffffffffffe8->normal;
  local_68._0_4_ = pVVar1->x;
  local_68._4_4_ = pVVar1->y;
  PVar4.x = pVVar1->x;
  PVar4.y = pVVar1->y;
  PVar4.z = pVVar1->z;
  unique0x10000209 = PVar3;
  fVar2 = dotProduct((Vector *)local_28,(Vector *)local_68);
  PVar4 = operator*(PVar4,fVar2 + fVar2);
  local_a8[0].z = PVar4.z;
  local_78.z = local_a8[0].z;
  local_a8[0]._0_8_ = PVar4._0_8_;
  local_78.x = local_a8[0].x;
  local_78.y = local_a8[0].y;
  operator-=((Vector *)local_28,&local_78);
  (__return_storage_ptr__->a).z = (segment->b).z;
  fVar2 = (segment->b).y;
  (__return_storage_ptr__->a).x = (segment->b).x;
  (__return_storage_ptr__->a).y = fVar2;
  PVar4 = operator+(segment->b,(Vector *)local_28);
  local_d8 = PVar4._0_8_;
  (__return_storage_ptr__->b).x = (float)(undefined4)local_d8;
  (__return_storage_ptr__->b).y = (float)local_d8._4_4_;
  local_d0 = PVar4.z;
  (__return_storage_ptr__->b).z = local_d0;
  return __return_storage_ptr__;
}

Assistant:

Segment reflection(Segment const& segment, Triangle const& triangle)
{
  Vector ri = segment.b - segment.a;
  Vector N = triangle.normal;

  ri -= N * (2 * dotProduct(ri, N));
  return {segment.b, segment.b + ri};
}